

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O0

bool anon_unknown.dwarf_1cab89::MakeSpeakerMap
               (ALCdevice *device,AmbDecConf *conf,ALuint (*speakermap) [16])

{
  __normal_iterator<const_AmbDecConf::SpeakerConf_*,_std::vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>_>
  __last;
  const_iterator __first;
  uint *puVar1;
  size_type sVar2;
  uint *puVar3;
  uint (*in_RDX) [16];
  long in_RSI;
  uint *in_RDI;
  uint *spkrmap_end;
  anon_class_8_1_518f0f94 map_spkr;
  vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
  *in_stack_ffffffffffffffa8;
  anon_class_8_1_518f0f94 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  __normal_iterator<const_AmbDecConf::SpeakerConf_*,_std::vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>_>
  in_stack_ffffffffffffffc0;
  
  std::vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>::begin
            (in_stack_ffffffffffffffa8);
  __first = std::vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>::end
                      (in_stack_ffffffffffffffa8);
  std::begin<unsigned_int,16ul>(in_RDX);
  __last._M_current._4_4_ = in_stack_ffffffffffffffbc;
  __last._M_current._0_4_ = in_stack_ffffffffffffffb8;
  std::
  transform<__gnu_cxx::__normal_iterator<AmbDecConf::SpeakerConf_const*,std::vector<AmbDecConf::SpeakerConf,al::allocator<AmbDecConf::SpeakerConf,8ul>>>,unsigned_int*,(anonymous_namespace)::MakeSpeakerMap(ALCdevice*,AmbDecConf_const*,unsigned_int(&)[16])::__0>
            (in_stack_ffffffffffffffc0,__last,(uint *)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffb0);
  puVar1 = std::begin<unsigned_int,16ul>(in_RDX);
  sVar2 = std::vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>::size
                    ((vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                      *)(in_RSI + 0x38));
  puVar1 = puVar1 + sVar2;
  std::begin<unsigned_int,16ul>(in_RDX);
  puVar3 = std::find<unsigned_int*,unsigned_int>((uint *)__first._M_current,in_RDI,puVar1);
  return puVar3 == puVar1;
}

Assistant:

bool MakeSpeakerMap(ALCdevice *device, const AmbDecConf *conf, ALuint (&speakermap)[MAX_OUTPUT_CHANNELS])
{
    auto map_spkr = [device](const AmbDecConf::SpeakerConf &speaker) -> ALuint
    {
        /* NOTE: AmbDec does not define any standard speaker names, however
         * for this to work we have to by able to find the output channel
         * the speaker definition corresponds to. Therefore, OpenAL Soft
         * requires these channel labels to be recognized:
         *
         * LF = Front left
         * RF = Front right
         * LS = Side left
         * RS = Side right
         * LB = Back left
         * RB = Back right
         * CE = Front center
         * CB = Back center
         *
         * Additionally, surround51 will acknowledge back speakers for side
         * channels, and surround51rear will acknowledge side speakers for
         * back channels, to avoid issues with an ambdec expecting 5.1 to
         * use the side channels when the device is configured for back,
         * and vice-versa.
         */
        Channel ch{};
        if(speaker.Name == "LF")
            ch = FrontLeft;
        else if(speaker.Name == "RF")
            ch = FrontRight;
        else if(speaker.Name == "CE")
            ch = FrontCenter;
        else if(speaker.Name == "LS")
        {
            if(device->FmtChans == DevFmtX51Rear)
                ch = BackLeft;
            else
                ch = SideLeft;
        }
        else if(speaker.Name == "RS")
        {
            if(device->FmtChans == DevFmtX51Rear)
                ch = BackRight;
            else
                ch = SideRight;
        }
        else if(speaker.Name == "LB")
        {
            if(device->FmtChans == DevFmtX51)
                ch = SideLeft;
            else
                ch = BackLeft;
        }
        else if(speaker.Name == "RB")
        {
            if(device->FmtChans == DevFmtX51)
                ch = SideRight;
            else
                ch = BackRight;
        }
        else if(speaker.Name == "CB")
            ch = BackCenter;
        else
        {
            ERR("AmbDec speaker label \"%s\" not recognized\n", speaker.Name.c_str());
            return INVALID_CHANNEL_INDEX;
        }
        const ALuint chidx{GetChannelIdxByName(device->RealOut, ch)};
        if(chidx == INVALID_CHANNEL_INDEX)
            ERR("Failed to lookup AmbDec speaker label %s\n", speaker.Name.c_str());
        return chidx;
    };
    std::transform(conf->Speakers.begin(), conf->Speakers.end(), std::begin(speakermap), map_spkr);
    /* Return success if no invalid entries are found. */
    auto spkrmap_end = std::begin(speakermap) + conf->Speakers.size();
    return std::find(std::begin(speakermap), spkrmap_end, INVALID_CHANNEL_INDEX) == spkrmap_end;
}